

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::InlineReturn
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,DebugInlinedAtContext *inlined_at_ctx,Function *calleeFn,Instruction *inst,
          uint32_t returnVarId)

{
  uint32_t val_id;
  bool bVar1;
  Op OVar2;
  Operand *pOVar3;
  uint *puVar4;
  pointer pvVar5;
  Instruction *pIVar6;
  IRContext *pIVar7;
  DebugInfoManager *this_00;
  DebugScope *callee_instr_scope;
  undefined4 in_stack_00000014;
  uint32_t in_stack_00000018;
  undefined1 local_90 [16];
  iterator local_80;
  undefined1 local_70 [8];
  iterator callee_block_itr;
  DebugScope DStack_58;
  uint32_t returnLabelId;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_50;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_48;
  const_iterator mapItr;
  uint32_t valId;
  DebugInlinedAtContext *inlined_at_ctx_local;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *new_blk_ptr_local;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *new_blocks_local;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *callee2caller_local;
  InlinePass *this_local;
  
  OVar2 = Instruction::opcode((Instruction *)CONCAT44(in_stack_00000014,returnVarId));
  if (OVar2 == OpReturnValue) {
    if (in_stack_00000018 == 0) {
      __assert_fail("returnVarId != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp"
                    ,0x182,
                    "std::unique_ptr<BasicBlock> spvtools::opt::InlinePass::InlineReturn(const std::unordered_map<uint32_t, uint32_t> &, std::vector<std::unique_ptr<BasicBlock>> *, std::unique_ptr<BasicBlock>, analysis::DebugInlinedAtContext *, Function *, const Instruction *, uint32_t)"
                   );
    }
    pOVar3 = Instruction::GetInOperand((Instruction *)CONCAT44(in_stack_00000014,returnVarId),0);
    puVar4 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar3->words,0);
    mapItr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
    _4_4_ = *puVar4;
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)new_blocks,
                (key_type *)
                ((long)&mapItr.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 4));
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)new_blocks);
    bVar1 = std::__detail::operator!=(&local_48,&local_50);
    if (bVar1) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_48);
      mapItr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
      _4_4_ = pvVar5->second;
    }
    val_id = mapItr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
             _M_cur._4_4_;
    pIVar6 = Instruction::dbg_line_inst((Instruction *)CONCAT44(in_stack_00000014,returnVarId));
    pIVar7 = Pass::context((Pass *)callee2caller);
    this_00 = IRContext::get_debug_info_mgr(pIVar7);
    callee_instr_scope =
         Instruction::GetDebugScope((Instruction *)CONCAT44(in_stack_00000014,returnVarId));
    DStack_58 = analysis::DebugInfoManager::BuildDebugScope
                          (this_00,callee_instr_scope,(DebugInlinedAtContext *)calleeFn);
    AddStore((InlinePass *)callee2caller,in_stack_00000018,val_id,
             (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)inlined_at_ctx,pIVar6,&stack0xffffffffffffffa8);
  }
  callee_block_itr.iterator_._M_current._4_4_ = 0;
  _local_70 = Function::begin((Function *)inst);
  do {
    local_80 = Function::end((Function *)inst);
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_70,&local_80);
    if (!bVar1) {
LAB_003a0888:
      if (callee_block_itr.iterator_._M_current._4_4_ == 0) {
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      *)this,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                              *)inlined_at_ctx);
      }
      else {
        OVar2 = Instruction::opcode((Instruction *)CONCAT44(in_stack_00000014,returnVarId));
        if ((OVar2 == OpReturn) ||
           (OVar2 = Instruction::opcode((Instruction *)CONCAT44(in_stack_00000014,returnVarId)),
           OVar2 == OpReturnValue)) {
          AddBranch((InlinePass *)callee2caller,callee_block_itr.iterator_._M_current._4_4_,
                    (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)inlined_at_ctx);
        }
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::push_back((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     *)new_blk_ptr,(value_type *)inlined_at_ctx);
        NewLabel((InlinePass *)local_90,(uint32_t)callee2caller);
        MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                  ((spvtools *)this,
                   (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)local_90);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)local_90);
      }
      return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                )this;
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_70);
    BasicBlock::tail((BasicBlock *)(local_90 + 8));
    pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)(local_90 + 8));
    OVar2 = Instruction::opcode(pIVar6);
    bVar1 = spvOpcodeIsAbort(OVar2);
    if (bVar1) {
      pIVar7 = Pass::context((Pass *)callee2caller);
      callee_block_itr.iterator_._M_current._4_4_ = IRContext::TakeNextId(pIVar7);
      goto LAB_003a0888;
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_70);
  } while( true );
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::InlineReturn(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::unique_ptr<BasicBlock> new_blk_ptr,
    analysis::DebugInlinedAtContext* inlined_at_ctx, Function* calleeFn,
    const Instruction* inst, uint32_t returnVarId) {
  // Store return value to return variable.
  if (inst->opcode() == spv::Op::OpReturnValue) {
    assert(returnVarId != 0);
    uint32_t valId = inst->GetInOperand(kSpvReturnValueId).words[0];
    const auto mapItr = callee2caller.find(valId);
    if (mapItr != callee2caller.end()) {
      valId = mapItr->second;
    }
    AddStore(returnVarId, valId, &new_blk_ptr, inst->dbg_line_inst(),
             context()->get_debug_info_mgr()->BuildDebugScope(
                 inst->GetDebugScope(), inlined_at_ctx));
  }

  uint32_t returnLabelId = 0;
  for (auto callee_block_itr = calleeFn->begin();
       callee_block_itr != calleeFn->end(); ++callee_block_itr) {
    if (spvOpcodeIsAbort(callee_block_itr->tail()->opcode())) {
      returnLabelId = context()->TakeNextId();
      break;
    }
  }
  if (returnLabelId == 0) return new_blk_ptr;

  if (inst->opcode() == spv::Op::OpReturn ||
      inst->opcode() == spv::Op::OpReturnValue)
    AddBranch(returnLabelId, &new_blk_ptr);
  new_blocks->push_back(std::move(new_blk_ptr));
  return MakeUnique<BasicBlock>(NewLabel(returnLabelId));
}